

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

LY_ERR moveto_op_comp_item(lyxp_set *set1,uint32_t idx1,lyxp_set *set2,char *op,
                          ly_bool switch_operands,ly_bool *result)

{
  lysc_node *plVar1;
  lys_module *plVar2;
  ly_ctx *plVar3;
  code *pcVar4;
  LY_ERR LVar5;
  int iVar6;
  lyxp_set_node *plVar7;
  lysc_node **pplVar8;
  size_t sVar9;
  char *pcVar10;
  lyxp_set_type type;
  lyxp_set *set2_00;
  lyxp_set *set1_00;
  lyd_node *plVar11;
  void *local_f8;
  lyd_value val;
  lyxp_set tmp1;
  
  memset(&tmp1,0,0x90);
  if (set1->type != LYXP_SET_NODE_SET) {
    __assert_fail("set1->type == LYXP_SET_NODE_SET",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                  0x1c5c,
                  "LY_ERR moveto_op_comp_item(const struct lyxp_set *, uint32_t, struct lyxp_set *, const char *, ly_bool, ly_bool *)"
                 );
  }
  type = (uint)(set2->type != LYXP_SET_BOOLEAN) * 2 + LYXP_SET_BOOLEAN;
  if (set2->type == LYXP_SET_NUMBER) {
    type = LYXP_SET_NUMBER;
  }
  LVar5 = set_comp_cast(&tmp1,set1,type,idx1);
  if (LVar5 != LY_SUCCESS) goto LAB_0019fe0d;
  plVar7 = (set1->val).nodes + idx1;
  local_f8 = (void *)0x0;
  if (set2->type == LYXP_SET_STRING) {
    if (plVar7->type == LYXP_NODE_META) {
      plVar11 = plVar7->node;
      pplVar8 = (lysc_node **)&plVar11->meta;
LAB_0019fcd9:
      plVar1 = *pplVar8;
      if (plVar1 != (lysc_node *)0x0) {
        iVar6 = *(int *)&plVar1->next;
        plVar2 = plVar1->parent->module;
        if (iVar6 == 0xb) {
          pcVar4 = lyplg_type_store_enum;
joined_r0x0019fd17:
          if (plVar2 == (lys_module *)pcVar4) goto LAB_0019fde1;
        }
        else {
          if (iVar6 == 8) {
            pcVar4 = lyplg_type_store_boolean;
            goto joined_r0x0019fd17;
          }
          if (iVar6 == 6) {
            pcVar4 = lyplg_type_store_string;
            goto joined_r0x0019fd17;
          }
        }
        pcVar10 = (set2->val).str;
        plVar3 = set2->ctx;
        sVar9 = strlen(pcVar10);
        iVar6 = (*(code *)plVar2)(plVar3,plVar1,pcVar10,sVar9,0,set2->format,set2->prefix_data,0x3f3
                                  ,plVar11->schema,&val,0,&local_f8);
        ly_err_free(local_f8);
        if ((iVar6 == 9) || (iVar6 == 0)) {
          free((set2->val).nodes);
          pcVar10 = lyd_value_get_canonical(set2->ctx,&val);
          pcVar10 = strdup(pcVar10);
          (set2->val).str = pcVar10;
          (*(code *)plVar1->parent->ref)(set2->ctx);
          if ((set2->val).nodes == (lyxp_set_node *)0x0) {
            LVar5 = LY_EMEM;
            ly_log(set2->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","set_comp_canonize"
                  );
            goto LAB_0019fe0d;
          }
        }
      }
    }
    else if (plVar7->type == LYXP_NODE_ELEM) {
      plVar11 = plVar7->node;
      if ((plVar11->schema != (lysc_node *)0x0) && ((plVar11->schema->nodetype & 0xc) != 0)) {
        pplVar8 = &plVar11[1].schema;
        goto LAB_0019fcd9;
      }
    }
  }
LAB_0019fde1:
  if (switch_operands == '\0') {
    set1_00 = &tmp1;
    set2_00 = set2;
  }
  else {
    set2_00 = &tmp1;
    set1_00 = set2;
  }
  LVar5 = moveto_op_comp(set1_00,set2_00,op,result);
LAB_0019fe0d:
  lyxp_set_free_content(&tmp1);
  return LVar5;
}

Assistant:

static LY_ERR
moveto_op_comp_item(const struct lyxp_set *set1, uint32_t idx1, struct lyxp_set *set2, const char *op,
        ly_bool switch_operands, ly_bool *result)
{
    struct lyxp_set tmp1 = {0};
    LY_ERR rc = LY_SUCCESS;

    assert(set1->type == LYXP_SET_NODE_SET);

    /* cast set1 */
    switch (set2->type) {
    case LYXP_SET_NUMBER:
        rc = set_comp_cast(&tmp1, set1, LYXP_SET_NUMBER, idx1);
        break;
    case LYXP_SET_BOOLEAN:
        rc = set_comp_cast(&tmp1, set1, LYXP_SET_BOOLEAN, idx1);
        break;
    default:
        rc = set_comp_cast(&tmp1, set1, LYXP_SET_STRING, idx1);
        break;
    }
    LY_CHECK_GOTO(rc, cleanup);

    /* canonize set2 */
    LY_CHECK_GOTO(rc = set_comp_canonize(set2, &set1->val.nodes[idx1]), cleanup);

    /* compare recursively and store the result */
    if (switch_operands) {
        LY_CHECK_GOTO(rc = moveto_op_comp(set2, &tmp1, op, result), cleanup);
    } else {
        LY_CHECK_GOTO(rc = moveto_op_comp(&tmp1, set2, op, result), cleanup);
    }

cleanup:
    lyxp_set_free_content(&tmp1);
    return rc;
}